

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node,REF_INT ldim,REF_DBL *field)

{
  REF_DBL RVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  long lVar5;
  REF_DBL *pRVar6;
  ulong uVar7;
  
  iVar2 = ref_node->max;
  if (0 < (long)iVar2) {
    lVar5 = 0;
    uVar4 = (uint)((uint)(ldim * -0x33333333) < 0x33333334) * 5;
    if (ldim < 6) {
      uVar4 = 0;
    }
    uVar7 = 6;
    if (0x2aaaaaaa <
        ((uint)(ldim * -0x55555555) >> 1 | (uint)((ldim * -0x55555555 & 1U) != 0) << 0x1f)) {
      uVar7 = (ulong)uVar4;
    }
    if (ldim < 7) {
      uVar7 = (ulong)uVar4;
    }
    pRVar3 = ref_node->global;
    pRVar6 = field + 3;
    do {
      if (-1 < pRVar3[lVar5]) {
        if (4 < ldim) {
          RVar1 = pRVar6[-1];
          pRVar6[-1] = *pRVar6;
          *pRVar6 = RVar1;
        }
        if (uVar7 != 0) {
          RVar1 = pRVar6[uVar7 - 1];
          pRVar6[uVar7 - 1] = pRVar6[uVar7];
          pRVar6[uVar7] = RVar1;
        }
      }
      lVar5 = lVar5 + 1;
      pRVar6 = pRVar6 + ldim;
    } while (iVar2 != lVar5);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_flip_twod_yz(REF_NODE ref_node, REF_INT ldim,
                                         REF_DBL *field) {
  REF_INT node;
  REF_DBL temp;
  REF_INT nequ;

  nequ = 0;
  if (ldim > 5 && 0 == ldim % 5) nequ = 5;
  if (ldim > 6 && 0 == ldim % 6) nequ = 6;

  each_ref_node_valid_node(ref_node, node) {
    if (ldim >= 5) {
      temp = field[2 + ldim * node];
      field[2 + ldim * node] = field[3 + ldim * node];
      field[3 + ldim * node] = temp;
    }
    if (nequ > 0) {
      temp = field[nequ + 2 + ldim * node];
      field[nequ + 2 + ldim * node] = field[nequ + 3 + ldim * node];
      field[nequ + 3 + ldim * node] = temp;
    }
  }

  return REF_SUCCESS;
}